

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::Calc_Sxi_D
          (ChElementBeamANCF_3243 *this,MatrixNx3c *Sxi_D,double xi,double eta,double zeta)

{
  double dVar1;
  VectorN Sxi_D_col;
  VectorN local_c0 [2];
  
  Calc_Sxi_xi_compact(this,local_c0,xi,eta,zeta);
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[1] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[2] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[3] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[4] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[5] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[6] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[7] =
       local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  dVar1 = this->m_thicknessY * 0.25;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[8] =
       0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[9] =
       0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[10] =
       (1.0 - xi) * dVar1;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0xb]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0xc]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0xd]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0xe]
       = (xi + 1.0) * dVar1;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0xf]
       = 0.0;
  dVar1 = this->m_thicknessZ * 0.25;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x10]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x11]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x12]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x13]
       = (1.0 - xi) * dVar1;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x14]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x15]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x16]
       = 0.0;
  (Sxi_D->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_0,_8,_3>_>).m_storage.m_data.array[0x17]
       = (xi + 1.0) * dVar1;
  return;
}

Assistant:

void ChElementBeamANCF_3243::Calc_Sxi_D(MatrixNx3c& Sxi_D, double xi, double eta, double zeta) {
    VectorN Sxi_D_col;
    Calc_Sxi_xi_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(0) = Sxi_D_col;

    Calc_Sxi_eta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(1) = Sxi_D_col;

    Calc_Sxi_zeta_compact(Sxi_D_col, xi, eta, zeta);
    Sxi_D.col(2) = Sxi_D_col;
}